

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_index_list.cpp
# Opt level: O3

void __thiscall duckdb::TableIndexList::RemoveIndex(TableIndexList *this,string *name)

{
  size_t __n;
  int iVar1;
  reference this_00;
  pointer pIVar2;
  undefined4 extraout_var;
  size_type __n_00;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    ::std::__throw_system_error(iVar1);
  }
  if ((this->indexes).
      super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->indexes).
      super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      this_00 = vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_true>
                ::operator[](&this->indexes,__n_00);
      pIVar2 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                         (this_00);
      iVar1 = (*pIVar2->_vptr_Index[4])(pIVar2);
      __n = ((undefined8 *)CONCAT44(extraout_var,iVar1))[1];
      if ((__n == name->_M_string_length) &&
         ((__n == 0 ||
          (iVar1 = bcmp(*(void **)CONCAT44(extraout_var,iVar1),(name->_M_dataplus)._M_p,__n),
          iVar1 == 0)))) {
        vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_true>::
        erase_at(&this->indexes,__n_00);
        break;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)((long)(this->indexes).
                                    super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->indexes).
                                    super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void TableIndexList::RemoveIndex(const string &name) {
	lock_guard<mutex> lock(indexes_lock);

	for (idx_t i = 0; i < indexes.size(); i++) {
		auto &index = indexes[i];
		if (index->GetIndexName() == name) {
			indexes.erase_at(i);
			break;
		}
	}
}